

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

float haarY(integral_image *iimage,int row,int col,int s)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *data;
  int iVar9;
  int iVar10;
  int _b;
  int iVar11;
  int data_width;
  int iVar12;
  int iVar13;
  int _b_1;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar14 [16];
  
  iVar10 = s / 2;
  iVar9 = col - iVar10;
  pfVar3 = iimage->data;
  iVar1 = iimage->data_width;
  iVar13 = iimage->width;
  iVar2 = iimage->height;
  iVar5 = row;
  if (iVar2 < row) {
    iVar5 = iVar2;
  }
  iVar11 = iVar5 + -1;
  iVar6 = iVar9;
  if (iVar13 < iVar9) {
    iVar6 = iVar13;
  }
  iVar12 = iVar6 + -1;
  iVar7 = iVar10 + row;
  if (iVar2 <= iVar10 + row) {
    iVar7 = iVar2;
  }
  iVar8 = iVar9 + s;
  if (iVar13 <= iVar9 + s) {
    iVar8 = iVar13;
  }
  auVar15 = ZEXT816(0) << 0x40;
  auVar14 = ZEXT816(0) << 0x40;
  if (0 < iVar6 && 0 < iVar5) {
    auVar14 = ZEXT416((uint)pfVar3[iVar11 * iVar1 + iVar12]);
  }
  iVar13 = iVar8 + -1;
  if (0 < iVar8 && 0 < iVar5) {
    auVar15 = ZEXT416((uint)pfVar3[iVar11 * iVar1 + iVar13]);
  }
  auVar17 = ZEXT816(0) << 0x40;
  auVar16 = ZEXT816(0) << 0x40;
  if (0 < iVar7 && 0 < iVar6) {
    auVar16 = ZEXT416((uint)pfVar3[(iVar7 + -1) * iVar1 + iVar12]);
  }
  if (0 < iVar8 && 0 < iVar7) {
    auVar17 = ZEXT416((uint)pfVar3[(iVar7 + -1) * iVar1 + iVar13]);
  }
  iVar9 = row - iVar10;
  if (iVar2 < row - iVar10) {
    iVar9 = iVar2;
  }
  auVar18 = ZEXT816(0) << 0x40;
  auVar19 = ZEXT816(0) << 0x40;
  if (0 < iVar9 && 0 < iVar6) {
    auVar19 = ZEXT416((uint)pfVar3[(iVar9 + -1) * iVar1 + iVar12]);
  }
  if (0 < iVar8 && 0 < iVar9) {
    auVar18 = ZEXT416((uint)pfVar3[(iVar9 + -1) * iVar1 + iVar13]);
  }
  auVar21 = ZEXT816(0) << 0x40;
  auVar20 = ZEXT816(0) << 0x40;
  if (0 < iVar6 && 0 < iVar5) {
    auVar20 = ZEXT416((uint)pfVar3[iVar11 * iVar1 + iVar12]);
  }
  if (0 < iVar8 && 0 < iVar5) {
    auVar21 = ZEXT416((uint)pfVar3[iVar11 * iVar1 + iVar13]);
  }
  auVar17 = vinsertps_avx(auVar17,auVar21,0x10);
  auVar14 = vinsertps_avx(auVar14,auVar19,0x10);
  auVar15 = vinsertps_avx(auVar15,auVar18,0x10);
  auVar14 = vsubps_avx(auVar14,auVar15);
  auVar15 = vinsertps_avx(auVar16,auVar20,0x10);
  auVar15 = vsubps_avx(auVar14,auVar15);
  auVar14._0_4_ = auVar15._0_4_ + auVar17._0_4_;
  auVar14._4_4_ = auVar15._4_4_ + auVar17._4_4_;
  auVar14._8_4_ = auVar15._8_4_ + auVar17._8_4_;
  auVar14._12_4_ = auVar15._12_4_ + auVar17._12_4_;
  uVar4 = vcmpps_avx512vl(auVar14,auVar14,7);
  auVar14 = vmaxps_avx512vl(ZEXT816(0) << 0x20,auVar14);
  auVar15._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar14._4_4_;
  auVar15._0_4_ = (uint)((byte)uVar4 & 1) * auVar14._0_4_;
  auVar15._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar14._8_4_;
  auVar15._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar14._12_4_;
  auVar15 = vhsubps_avx(auVar15,auVar15);
  return auVar15._0_4_;
}

Assistant:

inline float haarY(struct integral_image *iimage, int row, int col, int s) {
    return box_integral(iimage, row, col-s/2, s/2, s) - box_integral(iimage, row-s/2, col-s/2, s/2, s); // 1 x add + 2 x box_integral(3 x add + 1 x fmax) => Total: 7 x add + 2 x fmax
}